

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.h
# Opt level: O2

Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>_> * __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
AddFromCleared<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>>
          (RepeatedPtrFieldBase *this)

{
  int iVar1;
  int iVar2;
  void **ppvVar3;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>_> *pVVar4;
  int __old_val;
  
  iVar1 = this->current_size_;
  iVar2 = allocated_size(this);
  if (iVar1 < iVar2) {
    iVar1 = this->current_size_;
    this->current_size_ = iVar1 + 1;
    ppvVar3 = element_at(this,iVar1);
    pVVar4 = (Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>_> *)
             *ppvVar3;
  }
  else {
    pVVar4 = (Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>_> *)
             0x0;
  }
  return pVVar4;
}

Assistant:

Value<TypeHandler>* AddFromCleared() {
    if (current_size_ < allocated_size()) {
      return cast<TypeHandler>(
          element_at(ExchangeCurrentSize(current_size_ + 1)));
    } else {
      return nullptr;
    }
  }